

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

void canonicalize_path(char *path)

{
  char cVar1;
  char cVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  char *__dest;
  char *pcVar7;
  char *__s;
  int iVar8;
  int iVar9;
  char *__s_00;
  bool bVar10;
  
  __s_00 = path + -1;
  do {
    cVar1 = __s_00[1];
    __s_00 = __s_00 + 1;
  } while (cVar1 == '/');
  if (cVar1 == '\0') {
    bVar10 = false;
  }
  else {
    __dest = (char *)0x0;
    pcVar5 = __s_00;
    iVar8 = 0;
    do {
      __s = pcVar5 + -1;
      lVar6 = 0;
      cVar2 = cVar1;
      while ((cVar2 != '\0' && (cVar2 != '/'))) {
        lVar3 = lVar6 + 1;
        lVar6 = lVar6 + 1;
        __s = __s + 1;
        cVar2 = pcVar5[lVar3];
      }
      do {
        pcVar7 = __s + 1;
        __s = __s + 1;
      } while (*pcVar7 == '/');
      iVar9 = iVar8;
      if (lVar6 == 1) {
        pcVar7 = __dest;
        __dest = pcVar5;
        if (cVar1 != '.') goto LAB_0020a5c8;
LAB_0020a5ab:
        sVar4 = strlen(__s);
        memmove(__dest,__s,sVar4 + 1);
        __s = pcVar5;
        pcVar5 = pcVar7;
        iVar9 = iVar8 + 1;
      }
      else if ((((lVar6 == 2) && (cVar1 == '.')) && (pcVar5[1] == '.')) &&
              (iVar9 = iVar8 + 1, __dest != (char *)0x0)) {
        cVar1 = *__dest;
        if (cVar1 == '.') {
          if (__dest[1] == '.') {
            cVar1 = __dest[2];
            goto joined_r0x0020a5e6;
          }
        }
        else {
joined_r0x0020a5e6:
          if (cVar1 == '/') goto LAB_0020a5c8;
        }
        pcVar5 = __s_00;
        pcVar7 = (char *)0x0;
        goto LAB_0020a5ab;
      }
LAB_0020a5c8:
      __dest = pcVar5;
      cVar1 = *__s;
      pcVar5 = __s;
      iVar8 = iVar9;
    } while (cVar1 != '\0');
    bVar10 = iVar9 != 0;
  }
  sVar4 = strlen(__s_00);
  if (0 < (long)sVar4) {
    pcVar5 = __s_00 + sVar4;
    do {
      if (pcVar5[-1] != '/') break;
      pcVar5 = pcVar5 + -1;
      *pcVar5 = '\0';
    } while (__s_00 < pcVar5);
  }
  if ((bool)(*path == '\0' & bVar10)) {
    path[0] = '.';
    path[1] = '\0';
  }
  return;
}

Assistant:

void canonicalize_path(char *path)
{
    char *orig = path;
    char *p;
    char *ele, *prvele;
    char *trimpt = 0;
    int dotcnt = 0;

    /* 
     *   First, skip the root element.  This is unremovable.  For Unix, the
     *   root element is simply a leading slash (or series of slashes).  For
     *   DOS/Win, we can also have drive letters and UNC paths (as in
     *   \\MACHINE\ROOT).
     */
#ifdef MSDOS
    /* check for a UNC path or drive letter */
    if (path[0] == '\\' && path[1] == '\\')
    {
        /* skip to the \ after the machine name */
        for (path += 2 ; *path != '\0' && *path != '\\' && *path != '/' ;
             ++path) ;

        /* 
         *   further skip to the slash after that, as the drive name is part
         *   of the root as well 
         */
        if (*path != '\0')
        {
            /* find the slash */
            for (++path ; *path != '\0' && *path != '\\' && *path != '/' ;
                 ++path) ;

            /* we can trim this slash if the path ends here */
            trimpt = path;
        }
    }
    else if (path[1] == ':' && isalpha(path[0]))
    {
        /* skip the drive letter */
        path += 2;
    }
#endif

    /* skip leading slashes */
    for ( ; ispathchar(*path) ; ++path) ;

    /* 
     *   if we didn't choose a different trim starting point, trim from after
     *   the root slashes 
     */
    if (trimpt == 0)
        trimpt = path;

    /* scan elements */
    for (p = ele = path, prvele = 0 ; *ele != '\0' ; )
    {
        size_t ele_len;

        /* find the end of the current element */
        for ( ; *p != '\0' && !ispathchar(*p) ; ++p) ;
        ele_len = p - ele;

        /* skip adjacent path separators */
        for ( ; ispathchar(*p) ; ++p) ;

        /* check for special elements */
        if (ele_len == 1 && ele[0] == '.')
        {
            /* '.' -> current directory; simply remove this element */
            ++dotcnt;
            memmove(ele, p, strlen(p) + 1);

            /* revisit this element */
            p = ele;
        }
        else if (ele_len == 2 && ele[0] == '.' && ele[1] == '.')
        {
            /* 
             *   '..' -> parent directory; remove this element and the
             *   previous element.  If there is no previous element, or the
             *   previous element is a DOS drive letter or root path slash,
             *   we can't remove it.  Leaving a '..' at the root level will
             *   result in an invalid path, but it would change the meaning
             *   to remove it, so leave it intact.
             *   
             *   There's also a special case if the previous element is
             *   another '..'.  If so, it means this was an unremovable '..',
             *   so we can't do any combining - we need to keep this '..'
             *   AND the previous '..' to retain the meaning.
             */
            ++dotcnt;
            if (prvele == 0
                || ispathchar(*prvele)
                || (prvele[0] == '.' && prvele[1] == '.'
                    && ispathchar(prvele[2]))
#ifdef MSDOS
                || (prvele == path && path[1] == ':' && isalpha(path[0]))
#endif
               )
                prvele = 0;

            /* remove the previous element */
            if (prvele != 0)
            {
                /* remove the element */
                memmove(prvele, p, strlen(p) + 1);

                /* 
                 *   start the scan over from the beginning; this is a little
                 *   inefficient, but it's the easiest way to ensure
                 *   accuracy, since we'd otherwise have to back up to find
                 *   the previous element, which can be tricky 
                 */
                p = ele = path;
                prvele = 0;
            }
            else
            {
                /* 
                 *   no previous element, so keep the .. as it is and move on
                 *   to the next element 
                 */
                prvele = ele;
                ele = p;
            }
        }
        else
        {
            /* ordinary element - move on to the next element */
            prvele = ele;
            ele = p;
        }
    }

    /* if we left any trailing slashes, remove them */
    for (p = trimpt + strlen(trimpt) ;
         p > trimpt && ispathchar(*(p-1)) ;
         *--p = '\0') ;

    /*
     *   If that left us with an empty string, and we had one or more "." or
     *   ".."  elements, the "." and ".." elements must have canceled out the
     *   other elements.  In this case return "." as the result. 
     */
    if (orig[0] == '\0' && dotcnt != 0)
    {
        orig[0] = '.';
        orig[1] = '\0';
    }
}